

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<unsigned_char_const>const&>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> *params)

{
  ArrayPtr<const_unsigned_char> *this_00;
  ArrayPtr<const_unsigned_char> *value;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> *params_00;
  Delimited<kj::ArrayPtr<const_unsigned_char>_> local_50;
  kj *local_18;
  ArrayPtr<const_unsigned_char> *params_local;
  
  local_18 = this;
  params_local = (ArrayPtr<const_unsigned_char> *)__return_storage_ptr__;
  this_00 = fwd<kj::ArrayPtr<unsigned_char_const>const&>((ArrayPtr<const_unsigned_char> *)this);
  toCharSequence<kj::ArrayPtr<unsigned_char_const>const&>(&local_50,(kj *)this_00,value);
  _::concat<kj::_::Delimited<kj::ArrayPtr<unsigned_char_const>>>
            (__return_storage_ptr__,(_ *)&local_50,params_00);
  _::Delimited<kj::ArrayPtr<const_unsigned_char>_>::~Delimited(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}